

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__resample_horizontal_gather
               (stbir__info *stbir_info,float *output_buffer,float *input_buffer)

{
  void *in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  float *decode_buffer;
  
  if (((*(int *)((long)in_RDI + 0x44) != 6) || (*(float *)(in_RDI + 5) != 1.0)) ||
     (NAN(*(float *)(in_RDI + 5)))) {
    (*(code *)in_RDI[0x37])
              (in_RSI,*(undefined4 *)((long)in_RDI + 0x24),
               (void *)((long)in_RDX +
                       (long)(*(int *)(in_RDI + 0x2e) * *(int *)((long)in_RDI + 500)) * -4),*in_RDI,
               in_RDI[1],*(undefined4 *)((long)in_RDI + 0x5c));
  }
  else {
    stbir_simd_memcpy(in_RSI,in_RDX,
                      (long)*(int *)((long)in_RDI + 0x24) * 4 * (long)*(int *)((long)in_RDI + 500));
  }
  return;
}

Assistant:

static void stbir__resample_horizontal_gather(stbir__info const * stbir_info, float* output_buffer, float const * input_buffer STBIR_ONLY_PROFILE_GET_SPLIT_INFO )
{
  float const * decode_buffer = input_buffer - ( stbir_info->scanline_extents.conservative.n0 * stbir_info->effective_channels );

  STBIR_PROFILE_START( horizontal );
  if ( ( stbir_info->horizontal.filter_enum == STBIR_FILTER_POINT_SAMPLE ) && ( stbir_info->horizontal.scale_info.scale == 1.0f ) )
    STBIR_MEMCPY( output_buffer, input_buffer, stbir_info->horizontal.scale_info.output_sub_size * sizeof( float ) * stbir_info->effective_channels );
  else
    stbir_info->horizontal_gather_channels( output_buffer, stbir_info->horizontal.scale_info.output_sub_size, decode_buffer, stbir_info->horizontal.contributors, stbir_info->horizontal.coefficients, stbir_info->horizontal.coefficient_width );
  STBIR_PROFILE_END( horizontal );
}